

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::FiberPool::Impl::disposeImpl(Impl *this,void *pointer)

{
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *this_00;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *this_01;
  long *plVar1;
  _Map_pointer pppFVar2;
  _Elt_pointer ppFVar3;
  _Elt_pointer ppFVar4;
  FiberStack *pFVar5;
  long lVar6;
  FiberStack *stack;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  _kjDefer663;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  FiberStack *local_50;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  local_48;
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *local_38;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_48.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
        )&local_50;
  local_48.maybeFunc.ptr.isSet = true;
  local_50 = (FiberStack *)pointer;
  if (*(int *)((long)pointer + 8) == 0) {
    lookupCoreLocalFreelist((Impl *)&stack0xffffffffffffffd8);
    if (CONCAT71(uStack_27,local_28) != 0) {
      lVar6 = 0;
      pFVar5 = local_50;
      do {
        LOCK();
        plVar1 = (long *)(CONCAT71(uStack_27,local_28) + lVar6);
        local_50 = (FiberStack *)*plVar1;
        *plVar1 = (long)pFVar5;
        UNLOCK();
        if (local_50 == (FiberStack *)0x0) goto LAB_004002fd;
        lVar6 = lVar6 + 8;
        pFVar5 = local_50;
      } while (lVar6 != 0x10);
    }
    this_00 = &this->freelist;
    local_28 = 0;
    kj::_::Mutex::lock(&this_00->mutex,0);
    this_01 = &(this->freelist).value;
    ppFVar4 = (this->freelist).value.
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    local_38 = this_00;
    local_30 = this_01;
    if (ppFVar4 ==
        (this->freelist).value.
        super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<kj::_::FiberStack*,std::allocator<kj::_::FiberStack*>>::
      _M_push_back_aux<kj::_::FiberStack*const&>
                ((deque<kj::_::FiberStack*,std::allocator<kj::_::FiberStack*>> *)this_01,&local_50);
      ppFVar4 = (this->freelist).value.
                super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_cur;
    }
    else {
      *ppFVar4 = local_50;
      ppFVar4 = (this->freelist).value.
                super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl
                .super__Deque_impl_data._M_finish._M_cur + 1;
      (this->freelist).value.
      super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = ppFVar4;
    }
    pppFVar2 = (this->freelist).value.
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
    ppFVar3 = (this->freelist).value.
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if (this->maxFreelist <
        ((long)(this->freelist).value.
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_last - (long)ppFVar3 >> 3) +
        ((((ulong)((long)pppFVar2 -
                  (long)(this->freelist).value.
                        super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppFVar2 == (_Map_pointer)0x0)) * 0x40 +
        ((long)ppFVar4 -
         (long)(this->freelist).value.
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3)) {
      local_50 = *ppFVar3;
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_front(this_01);
    }
    else {
      local_50 = (FiberStack *)0x0;
    }
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
LAB_004002fd:
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:663:5)>
  ::run(&local_48);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    _::FiberStack* stack = reinterpret_cast<_::FiberStack*>(pointer);
    KJ_DEFER(delete stack);

    // Verify that the stack was reset before returning, otherwise it might be in a weird state
    // where we don't want to reuse it.
    if (stack->isReset()) {
#if USE_CORE_LOCAL_FREELISTS
      KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
        for (auto& stackPtr: core.stacks) {
          stack = __atomic_exchange_n(&stackPtr, stack, __ATOMIC_RELEASE);
          if (stack == nullptr) {
            // Cool, we inserted the stack into an unused slot. We're done.
            return;
          }
        }
        // All slots were occupied, so we inserted the new stack in the front, pushed the rest back,
        // and now `stack` refers to the stack that fell off the end of the core-local list. That
        // needs to go into the global freelist.
      }
#endif

      auto lock = freelist.lockExclusive();
      lock->push_back(stack);
      if (lock->size() > maxFreelist) {
        stack = lock->front();
        lock->pop_front();
      } else {
        stack = nullptr;
      }
    }
  }